

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Iterator<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
          (Iterator<int,_false,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Iterator<int,_false,_std::allocator<unsigned_long>_> *this,int param_1)

{
  size_t sVar1;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  
  if ((this->view_ != (view_pointer)0x0) && (sVar1 = this->index_, sVar1 != 0)) {
    __return_storage_ptr__->view_ = this->view_;
    __return_storage_ptr__->pointer_ = this->pointer_;
    __return_storage_ptr__->index_ = sVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->coordinates_,&this->coordinates_);
    testInvariant(__return_storage_ptr__);
    operator--(this);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,param_1));
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline Iterator<T, isConst, A> 
Iterator<T, isConst, A>::operator--(int)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || (view_ != 0 && index_ > 0));
    Iterator<T, isConst, A> copy = *this;
    --(*this);
    return copy;
}